

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch.hpp
# Opt level: O0

void Catch::
     deleteAllValues<std::map<std::__cxx11::string,Catch::IReporterFactory*,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,Catch::IReporterFactory*>>>>
               (map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Catch::IReporterFactory_*,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Catch::IReporterFactory_*>_>_>
                *container)

{
  bool bVar1;
  pointer ppVar2;
  iterator local_30;
  _Rb_tree_const_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Catch::IReporterFactory_*>_>
  local_28;
  const_iterator itEnd;
  _Rb_tree_const_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Catch::IReporterFactory_*>_>
  local_18;
  const_iterator it;
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Catch::IReporterFactory_*,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Catch::IReporterFactory_*>_>_>
  *container_local;
  
  it._M_node = (_Base_ptr)container;
  itEnd._M_node =
       (_Base_ptr)
       std::
       map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Catch::IReporterFactory_*,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Catch::IReporterFactory_*>_>_>
       ::begin(container);
  std::
  _Rb_tree_const_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Catch::IReporterFactory_*>_>
  ::_Rb_tree_const_iterator(&local_18,(iterator *)&itEnd);
  local_30._M_node =
       (_Base_ptr)
       std::
       map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Catch::IReporterFactory_*,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Catch::IReporterFactory_*>_>_>
       ::end(it._M_node);
  std::
  _Rb_tree_const_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Catch::IReporterFactory_*>_>
  ::_Rb_tree_const_iterator(&local_28,&local_30);
  while( true ) {
    bVar1 = std::operator!=(&local_18,&local_28);
    if (!bVar1) break;
    ppVar2 = std::
             _Rb_tree_const_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Catch::IReporterFactory_*>_>
             ::operator->(&local_18);
    if (ppVar2->second != (IReporterFactory *)0x0) {
      (*ppVar2->second->_vptr_IReporterFactory[1])();
    }
    std::
    _Rb_tree_const_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Catch::IReporterFactory_*>_>
    ::operator++(&local_18);
  }
  return;
}

Assistant:

inline void deleteAllValues( AssociativeContainerT& container ) {
        typename AssociativeContainerT::const_iterator it = container.begin();
        typename AssociativeContainerT::const_iterator itEnd = container.end();
        for(; it != itEnd; ++it )
            delete it->second;
    }